

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDisplayNode.cpp
# Opt level: O3

void __thiscall MinVR::VRDisplayNode::clearChildren(VRDisplayNode *this,bool destroyChildren)

{
  pointer ppVVar1;
  pointer ppVVar2;
  undefined3 in_register_00000031;
  pointer ppVVar3;
  
  if (CONCAT31(in_register_00000031,destroyChildren) == 0) {
    ppVVar2 = (this->_children).
              super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    ppVVar3 = (this->_children).
              super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppVVar1 = (this->_children).
              super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppVVar2 = ppVVar3;
    if (ppVVar3 != ppVVar1) {
      do {
        if (*ppVVar3 != (VRDisplayNode *)0x0) {
          (*(*ppVVar3)->_vptr_VRDisplayNode[1])();
          ppVVar1 = (this->_children).
                    super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        ppVVar3 = ppVVar3 + 1;
        ppVVar2 = ppVVar1;
      } while (ppVVar3 != ppVVar1);
    }
  }
  ppVVar3 = (this->_children).
            super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppVVar2 != ppVVar3) {
    (this->_children).
    super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVVar3;
  }
  return;
}

Assistant:

void VRDisplayNode::clearChildren(bool destroyChildren) {
	if (destroyChildren) {
		for (std::vector<VRDisplayNode*>::iterator it = _children.begin(); it != _children.end(); it++) {
				delete (*it);
		}
	}

	_children.clear();
}